

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

float Gia_ManEvaluateSwitching(Gia_Man_t *p)

{
  long lVar1;
  float fVar2;
  
  if (p->pSwitching == (uchar *)0x0) {
    __assert_fail("p->pSwitching",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                  ,0x2d4,"float Gia_ManEvaluateSwitching(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  if ((long)p->nObjs < 1) {
LAB_00230fff:
    fVar2 = 0.0;
  }
  else {
    lVar1 = 0;
    fVar2 = 0.0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00230fff;
      fVar2 = fVar2 + ((float)p->pSwitching[lVar1] * (float)p->pRefs[lVar1]) / 255.0;
      lVar1 = lVar1 + 1;
    } while (p->nObjs != lVar1);
  }
  return fVar2;
}

Assistant:

float Gia_ManEvaluateSwitching( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    float SwitchTotal = 0.0;
    int i;
    assert( p->pSwitching );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachObj( p, pObj, i )
        SwitchTotal += (float)Gia_ObjRefNum(p, pObj) * p->pSwitching[i] / 255;
    return SwitchTotal;
}